

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O2

void addMeanSquareError<CoreML::Specification::NeuralNetworkClassifier>
               (Model *m,NeuralNetworkClassifier *nn,char *lossName,char *mseInputName,
               char *targetName)

{
  NetworkUpdateParameters *pNVar1;
  LossLayer *this;
  MeanSquaredErrorLossLayer *this_00;
  Type *from;
  FeatureDescription *this_01;
  ModelDescription *pMVar2;
  FeatureDescription output;
  FeatureDescription FStack_58;
  
  pNVar1 = CoreML::Specification::NeuralNetworkClassifier::mutable_updateparams(nn);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::Add
                   (&pNVar1->losslayers_);
  CoreML::Specification::LossLayer::set_name(this,lossName);
  this_00 = CoreML::Specification::LossLayer::mutable_meansquarederrorlosslayer(this);
  CoreML::Specification::MeanSquaredErrorLossLayer::set_input(this_00,mseInputName);
  CoreML::Specification::MeanSquaredErrorLossLayer::set_target(this_00,targetName);
  pMVar2 = m->description_;
  if (pMVar2 == (ModelDescription *)0x0) {
    pMVar2 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  from = google::protobuf::internal::RepeatedPtrFieldBase::
         Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                   (&(pMVar2->output_).super_RepeatedPtrFieldBase,0);
  CoreML::Specification::FeatureDescription::FeatureDescription(&FStack_58,from);
  pMVar2 = CoreML::Specification::Model::mutable_description(m);
  this_01 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (&pMVar2->traininginput_);
  CoreML::Specification::FeatureDescription::CopyFrom(this_01,&FStack_58);
  CoreML::Specification::FeatureDescription::set_name(this_01,(this_00->target_).ptr_);
  CoreML::Specification::FeatureDescription::~FeatureDescription(&FStack_58);
  return;
}

Assistant:

void addMeanSquareError(Specification::Model& m, NeuralNetworkClass *nn, const char *lossName, const char *mseInputName, const char *targetName) {

    // set a MSE loss layer
    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name(lossName);
    Specification::MeanSquaredErrorLossLayer *mseLossLayer = lossLayer->mutable_meansquarederrorlosslayer();
    mseLossLayer->set_input(mseInputName);
    mseLossLayer->set_target(targetName);

    auto output = m.description().output(0);
    auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
    trainingInput->CopyFrom(output);
    trainingInput->set_name(mseLossLayer->target());

}